

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::timestamp_t,duckdb::date_t,duckdb::UnaryLambdaWrapper,duckdb::date_t(*)(duckdb::timestamp_t)>
               (timestamp_t *ldata,date_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  timestamp_t input;
  timestamp_t input_00;
  timestamp_t input_01;
  unsigned_long uVar1;
  bool bVar2;
  date_t dVar3;
  unsigned_long uVar4;
  TemplatedValidityMask<unsigned_long> *in_RCX;
  unsigned_long in_RDX;
  void *in_RSI;
  void *in_RDI;
  byte in_stack_00000008;
  idx_t i;
  idx_t start;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t base_idx;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  date_t in_stack_ffffffffffffff64;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff68;
  ulong idx;
  ValidityMask *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  date_t in_stack_ffffffffffffff7c;
  idx_t in_stack_ffffffffffffff80;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff88;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff90;
  unsigned_long local_58;
  ulong local_50;
  ulong local_48;
  unsigned_long local_40;
  byte local_31;
  TemplatedValidityMask<unsigned_long> *local_20;
  unsigned_long local_18;
  void *local_10;
  void *local_8;
  
  local_31 = in_stack_00000008 & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  AssertRestrictFunction
            (in_RDI,(void *)((long)in_RDI + in_RDX * 8),in_RSI,(void *)((long)in_RSI + in_RDX * 4),
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/include/duckdb/common/vector_operations/unary_executor.hpp"
             ,0x62);
  bVar2 = TemplatedValidityMask<unsigned_long>::AllValid(local_20);
  if (bVar2) {
    for (idx = 0; idx < local_18; idx = idx + 1) {
      input_01.value._4_4_ = in_stack_ffffffffffffff7c.days;
      input_01.value._0_4_ = in_stack_ffffffffffffff78;
      in_stack_ffffffffffffff64 =
           UnaryLambdaWrapper::
           Operation<duckdb::date_t(*)(duckdb::timestamp_t),duckdb::timestamp_t,duckdb::date_t>
                     (input_01,in_stack_ffffffffffffff70,idx,
                      (void *)CONCAT44(in_stack_ffffffffffffff64.days,in_stack_ffffffffffffff60));
      *(int32_t *)((long)local_10 + idx * 4) = in_stack_ffffffffffffff64.days;
    }
  }
  else {
    if ((local_31 & 1) == 0) {
      TemplatedValidityMask<unsigned_long>::Initialize
                ((TemplatedValidityMask<unsigned_long> *)
                 CONCAT44(in_stack_ffffffffffffff64.days,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Copy
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    }
    local_40 = 0;
    local_48 = TemplatedValidityMask<unsigned_long>::EntryCount(0xc242f7);
    for (local_50 = 0; local_50 < local_48; local_50 = local_50 + 1) {
      local_58 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                           (in_stack_ffffffffffffff68,
                            CONCAT44(in_stack_ffffffffffffff64.days,in_stack_ffffffffffffff60));
      uVar4 = MinValue<unsigned_long>(local_40 + 0x40,local_18);
      bVar2 = TemplatedValidityMask<unsigned_long>::AllValid(local_58);
      if (bVar2) {
        for (; uVar1 = local_40, local_40 < uVar4; local_40 = local_40 + 1) {
          input.value._4_4_ = in_stack_ffffffffffffff7c.days;
          input.value._0_4_ = in_stack_ffffffffffffff78;
          dVar3 = UnaryLambdaWrapper::
                  Operation<duckdb::date_t(*)(duckdb::timestamp_t),duckdb::timestamp_t,duckdb::date_t>
                            (input,in_stack_ffffffffffffff70,(idx_t)in_stack_ffffffffffffff68,
                             (void *)CONCAT44(in_stack_ffffffffffffff64.days,
                                              in_stack_ffffffffffffff60));
          *(int32_t *)((long)local_10 + local_40 * 4) = dVar3.days;
        }
      }
      else {
        bVar2 = TemplatedValidityMask<unsigned_long>::NoneValid(local_58);
        uVar1 = uVar4;
        if (!bVar2) {
          for (; uVar1 = local_40, local_40 < uVar4; local_40 = local_40 + 1) {
            bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                              (&local_58,(idx_t *)&stack0xffffffffffffff80);
            if (bVar2) {
              in_stack_ffffffffffffff70 = *(ValidityMask **)((long)local_8 + local_40 * 8);
              input_00.value._4_4_ = in_stack_ffffffffffffff7c.days;
              input_00.value._0_4_ = in_stack_ffffffffffffff78;
              in_stack_ffffffffffffff7c =
                   UnaryLambdaWrapper::
                   Operation<duckdb::date_t(*)(duckdb::timestamp_t),duckdb::timestamp_t,duckdb::date_t>
                             (input_00,in_stack_ffffffffffffff70,(idx_t)in_stack_ffffffffffffff68,
                              (void *)CONCAT44(in_stack_ffffffffffffff64.days,
                                               in_stack_ffffffffffffff60));
              *(int32_t *)((long)local_10 + local_40 * 4) = in_stack_ffffffffffffff7c.days;
            }
          }
        }
      }
      local_40 = uVar1;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}